

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transaction.cpp
# Opt level: O1

void __thiscall Transaction::Transaction(Transaction *this,int i,int m_)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_68;
  set<int,_std::less<int>,_std::allocator<int>_> *local_38;
  
  this->status = 's';
  this->m = m_;
  this->id = i;
  (this->t_status_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->t_status_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->t_status_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->t_status_mtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->t_status_mtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_38 = &this->writeSet;
  p_Var1 = &(this->writeSet)._M_t._M_impl.super__Rb_tree_header;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->readSet)._M_t._M_impl.super__Rb_tree_header;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->start_time).__d.__r = 0;
  (this->end_time).__d.__r = 0;
  p_Var3 = &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = p_Var3;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_38->_M_t);
  if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_68._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_68._M_impl.super__Rb_tree_header._M_node_count;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = p_Var3;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_68);
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = p_Var3;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->readSet)._M_t);
  if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_68._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_68._M_impl.super__Rb_tree_header._M_node_count;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = p_Var3;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_68);
  local_68._M_impl._0_8_ = (void *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->local_write_store,&local_68);
  if ((void *)local_68._M_impl._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._M_impl._0_8_,
                    (long)local_68._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_68._M_impl._0_8_);
  }
  if (0 < this->m) {
    iVar4 = 0;
    do {
      local_68._M_impl._0_4_ = 0xffffffff;
      __position._M_current =
           (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->local_write_store,__position,(int *)&local_68);
      }
      else {
        *__position._M_current = -1;
        (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->m);
  }
  return;
}

Assistant:

Transaction::Transaction(int i, int m_): id(i), m(m_), status('s') {
    writeSet = std::set<int>();
    readSet = std::set<int>();

    // initialize
    // Initially stores -1 for each item.
    local_write_store = std::vector<int>();
    for(int j=0; j<m; j++) local_write_store.push_back(-1);

}